

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

HTS_Boolean HTS_strequal(char *s1,char *s2)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  bool local_1;
  
  if ((in_RDI == (char *)0x0) && (in_RSI == (char *)0x0)) {
    local_1 = true;
  }
  else if ((in_RDI == (char *)0x0) || (in_RSI == (char *)0x0)) {
    local_1 = false;
  }
  else {
    iVar1 = strcmp(in_RDI,in_RSI);
    local_1 = iVar1 == 0;
  }
  return local_1;
}

Assistant:

static HTS_Boolean HTS_strequal(const char *s1, const char *s2)
{
   if (s1 == NULL && s2 == NULL)
      return TRUE;
   else if (s1 == NULL || s2 == NULL)
      return FALSE;
   else
      return strcmp(s1, s2) == 0 ? TRUE : FALSE;
}